

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall
FBehavior::StartTypedScripts
          (FBehavior *this,WORD type,AActor *activator,bool always,int arg1,bool runNow)

{
  DLevelScript *this_00;
  ScriptPtr *code;
  long lVar1;
  long lVar2;
  int arg1_local;
  
  if (0 < this->NumScripts) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      if ((&this->Scripts->Type)[lVar2] == type) {
        code = (ScriptPtr *)((long)&this->Scripts->Number + lVar2);
        this_00 = P_GetScriptGoing(activator,(line_t *)0x0,code->Number,code,this,&arg1_local,1,
                                   (uint)always * 2);
        if (runNow) {
          DLevelScript::RunScript(this_00);
        }
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x38;
    } while (lVar1 < this->NumScripts);
  }
  return;
}

Assistant:

void FBehavior::StartTypedScripts (WORD type, AActor *activator, bool always, int arg1, bool runNow)
{
	const ScriptPtr *ptr;
	int i;

	for (i = 0; i < NumScripts; ++i)
	{
		ptr = &Scripts[i];
		if (ptr->Type == type)
		{
			DLevelScript *runningScript = P_GetScriptGoing (activator, NULL, ptr->Number,
				ptr, this, &arg1, 1, always ? ACS_ALWAYS : 0);
			if (runNow)
			{
				runningScript->RunScript ();
			}
		}
	}
}